

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

bool __thiscall
duckdb::LocalStorage::NextParallelScan
          (LocalStorage *this,ClientContext *context,DataTable *table,
          ParallelCollectionScanState *state,CollectionScanState *scan_state)

{
  bool bVar1;
  LocalTableStorage *pLVar2;
  RowGroupCollection *this_00;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_20;
  
  local_20 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_20.ptr == (LocalTableStorage *)0x0) {
    bVar1 = false;
  }
  else {
    pLVar2 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&local_20);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&pLVar2->row_groups);
    bVar1 = RowGroupCollection::NextParallelScan(this_00,context,state,scan_state);
  }
  return bVar1;
}

Assistant:

bool LocalStorage::NextParallelScan(ClientContext &context, DataTable &table, ParallelCollectionScanState &state,
                                    CollectionScanState &scan_state) {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		return false;
	}
	return storage->row_groups->NextParallelScan(context, state, scan_state);
}